

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testIncorrectDecode(char *mc,Territory tc)

{
  MapcodeError MVar1;
  int rc;
  double lon;
  double lat;
  char *pcStack_10;
  Territory tc_local;
  char *mc_local;
  
  lat._4_4_ = tc;
  pcStack_10 = mc;
  MVar1 = decodeMapcodeToLatLonUtf8
                    (&lon,(double *)&stack0xffffffffffffffd8,mc,tc,(MapcodeElements *)0x0);
  if (~ERR_OK < MVar1) {
    foundError();
    printf("*** ERROR *** decodeMapcodeToLatLonUtf8 returns \'%d\' (should be non-0) for mapcode=\'%s\'\n"
           ,(ulong)(uint)MVar1,pcStack_10);
  }
  return 1;
}

Assistant:

static int testIncorrectDecode(char *mc, enum Territory tc) {
    double lat;
    double lon;
    int rc = decodeMapcodeToLatLonUtf8(&lat, &lon, mc, tc, NULL);
    if (rc >= 0) {
        foundError();
        printf("*** ERROR *** decodeMapcodeToLatLonUtf8 returns '%d' (should be non-0) for mapcode='%s'\n", rc, mc);
    }
    return 1;
}